

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool __thiscall deqp::gls::DrawTest::compare(DrawTest *this,Primitive primitiveType)

{
  Surface *pSVar1;
  Surface *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *this_00;
  undefined4 extraout_var_00;
  PixelFormat *this_01;
  Vector<int,_3> local_2e0;
  deUint32 local_2d4;
  Vector<int,_4> local_2d0;
  VecAccess<int,_4,_3> local_2c0;
  undefined1 local_2a4 [8];
  IVec3 renderTargetThreshold;
  Vector<int,_3> local_28c;
  Vector<unsigned_int,_4> local_280;
  ConstPixelBufferAccess local_270;
  ConstPixelBufferAccess local_248;
  undefined4 local_220;
  undefined4 local_21c;
  int maxAllowedInvalidPixelsWithTriangles;
  int maxAllowedInvalidPixelsWithLines;
  int maxAllowedInvalidPixelsWithPoints;
  PrimitiveClass primitiveClass;
  ConstPixelBufferAccess local_1e8;
  MessageBuilder local_1b0;
  Surface *local_30;
  Surface *screen;
  Surface *ref;
  DrawTest *pDStack_18;
  Primitive primitiveType_local;
  DrawTest *this_local;
  
  ref._4_4_ = primitiveType;
  pDStack_18 = this;
  screen = AttributePack::getSurface(this->m_rrArrayPack);
  local_30 = AttributePack::getSurface(this->m_glArrayPack);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar3));
  if (iVar3 < 2) {
    maxAllowedInvalidPixelsWithLines = getDrawPrimitiveClass(ref._4_4_);
    maxAllowedInvalidPixelsWithTriangles = 0;
    local_21c = 5;
    local_220 = 10;
    if (maxAllowedInvalidPixelsWithLines == PRIMITIVECLASS_POINT) {
      pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      tcu::Surface::getAccess(&local_248,screen);
      tcu::Surface::getAccess(&local_270,local_30);
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_280,this->m_maxDiffRed,this->m_maxDiffGreen,this->m_maxDiffBlue,0x100);
      tcu::Vector<int,_3>::Vector(&local_28c,1,1,0);
      this_local._7_1_ =
           tcu::intThresholdPositionDeviationErrorThresholdCompare
                     (pTVar4,"CompareResult","Result of rendering",&local_248,&local_270,&local_280,
                      &local_28c,true,0,COMPARE_LOG_RESULT);
    }
    else if (maxAllowedInvalidPixelsWithLines == PRIMITIVECLASS_LINE) {
      pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      pSVar2 = screen;
      pSVar1 = local_30;
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)(renderTargetThreshold.m_data + 1),this->m_maxDiffRed,
                 this->m_maxDiffGreen,this->m_maxDiffBlue);
      this_local._7_1_ =
           intersectionRelaxedLineImageCompare
                     (pTVar4,"CompareResult","Result of rendering",pSVar2,pSVar1,
                      (IVec3 *)(renderTargetThreshold.m_data + 1),5);
    }
    else if (maxAllowedInvalidPixelsWithLines == PRIMITIVECLASS_TRIANGLE) {
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      this_01 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
      local_2d4 = (deUint32)tcu::PixelFormat::getColorThreshold(this_01);
      tcu::RGBA::toIVec((RGBA *)&local_2d0);
      tcu::Vector<int,_4>::xyz(&local_2c0,&local_2d0);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)local_2a4);
      pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      pSVar2 = screen;
      pSVar1 = local_30;
      tcu::Vector<int,_3>::Vector
                (&local_2e0,this->m_maxDiffRed,this->m_maxDiffGreen,this->m_maxDiffBlue);
      this_local._7_1_ =
           edgeRelaxedImageCompare
                     (pTVar4,"CompareResult","Result of rendering",pSVar2,pSVar1,&local_2e0,
                      (IVec3 *)local_2a4,10);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1b0,
                         (char (*) [139])
                         "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
                        );
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::Surface::getAccess(&local_1e8,screen);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&maxAllowedInvalidPixelsWithPoints,local_30);
    this_local._7_1_ =
         tcu::fuzzyCompare(pTVar4,"Compare Results","Compare Results",&local_1e8,
                           (ConstPixelBufferAccess *)&maxAllowedInvalidPixelsWithPoints,0.3,
                           COMPARE_LOG_RESULT);
  }
  return this_local._7_1_;
}

Assistant:

bool DrawTest::compare (gls::DrawTestSpec::Primitive primitiveType)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		return tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 0.3f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		const PrimitiveClass	primitiveClass							= getDrawPrimitiveClass(primitiveType);
		const int				maxAllowedInvalidPixelsWithPoints		= 0;	//!< points are unlikely to have overlapping fragments
		const int				maxAllowedInvalidPixelsWithLines		= 5;	//!< line are allowed to have a few bad pixels
		const int				maxAllowedInvalidPixelsWithTriangles	= 10;

		switch (primitiveClass)
		{
			case PRIMITIVECLASS_POINT:
			{
				// Point are extremely unlikely to have overlapping regions, don't allow any no extra / missing pixels
				return tcu::intThresholdPositionDeviationErrorThresholdCompare(m_testCtx.getLog(),
																			   "CompareResult",
																			   "Result of rendering",
																			   ref.getAccess(),
																			   screen.getAccess(),
																			   tcu::UVec4(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 256),
																			   tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																			   true,								//!< relax comparison on the image boundary
																			   maxAllowedInvalidPixelsWithPoints,	//!< error threshold
																			   tcu::COMPARE_LOG_RESULT);
			}

			case PRIMITIVECLASS_LINE:
			{
				// Lines can potentially have a large number of overlapping pixels. Pixel comparison may potentially produce
				// false negatives in such pixels if for example the pixel in question is overdrawn by another line in the
				// reference image but not in the resultin image. Relax comparison near line intersection points (areas) and
				// compare only coverage, not color, in such pixels
				return intersectionRelaxedLineImageCompare(m_testCtx.getLog(),
														   "CompareResult",
														   "Result of rendering",
														   ref,
														   screen,
														   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
														   maxAllowedInvalidPixelsWithLines);
			}

			case PRIMITIVECLASS_TRIANGLE:
			{
				// Triangles are likely to partially or fully overlap. Pixel difference comparison is fragile in pixels
				// where there could be potential overlapping since the  pixels might be covered by one triangle in the
				// reference image and by the other in the result image. Relax comparsion near primitive edges and
				// compare only coverage, not color, in such pixels.
				const tcu::IVec3	renderTargetThreshold					= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().xyz();

				return edgeRelaxedImageCompare(m_testCtx.getLog(),
											   "CompareResult",
											   "Result of rendering",
											   ref,
											   screen,
											   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
											   renderTargetThreshold,
											   maxAllowedInvalidPixelsWithTriangles);
			}

			default:
				DE_ASSERT(false);
				return false;
		}
	}
}